

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

char * dict_ciphone_str(dict_t *d,s3wid_t wid,int32 pos)

{
  uint __line;
  char *pcVar1;
  
  if (d == (dict_t *)0x0) {
    pcVar1 = "d != NULL";
    __line = 0x44;
  }
  else if ((wid < 0) || (d->n_word <= wid)) {
    pcVar1 = "(wid >= 0) && (wid < d->n_word)";
    __line = 0x45;
  }
  else {
    if (-1 < pos) {
      if (pos < d->word[(uint)wid].pronlen) {
        pcVar1 = bin_mdef_ciphone_str(d->mdef,(int)d->word[(uint)wid].ciphone[(uint)pos]);
        return pcVar1;
      }
    }
    pcVar1 = "(pos >= 0) && (pos < d->word[wid].pronlen)";
    __line = 0x46;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,__line,"const char *dict_ciphone_str(dict_t *, s3wid_t, int32)");
}

Assistant:

const char *
dict_ciphone_str(dict_t * d, s3wid_t wid, int32 pos)
{
    assert(d != NULL);
    assert((wid >= 0) && (wid < d->n_word));
    assert((pos >= 0) && (pos < d->word[wid].pronlen));

    return bin_mdef_ciphone_str(d->mdef, d->word[wid].ciphone[pos]);
}